

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

void si9ma::BinaryTree::print_in_order(TreeNode *head,int height,int len,string *to)

{
  TreeNode *pTVar1;
  ostream *poVar2;
  int num;
  int num_00;
  long lVar3;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string val;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (head != (TreeNode *)0x0) {
    pTVar1 = head->right;
    std::__cxx11::string::string((string *)&local_50,"v",(allocator *)&val);
    print_in_order(pTVar1,height + 1,len,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::to_string(&local_110,head->value);
    std::operator+(&local_f0,to,&local_110);
    std::operator+(&val,&local_f0,to);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    lVar3 = (long)len - val._M_string_length;
    get_space_abi_cxx11_(&local_70,(BinaryTree *)(lVar3 / 2 & 0xffffffff),(int)(lVar3 % 2));
    std::operator+(&local_110,&local_70,&val);
    get_space_abi_cxx11_(&local_90,(BinaryTree *)(lVar3 - lVar3 / 2 & 0xffffffff),num);
    std::operator+(&local_f0,&local_110,&local_90);
    std::__cxx11::string::operator=((string *)&val,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    get_space_abi_cxx11_(&local_110,(BinaryTree *)(ulong)(uint)(height * len),num_00);
    std::operator+(&local_f0,&local_110,&val);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_f0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    pTVar1 = head->left;
    std::__cxx11::string::string((string *)&local_b0,"^",(allocator *)&local_f0);
    print_in_order(pTVar1,height + 1,len,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&val);
  }
  return;
}

Assistant:

void BinaryTree::print_in_order(const TreeNode *head, int height, int len, string to) {
        if (head == nullptr)
            return;

        print_in_order(head->right,height + 1,len,"v");
        string val = to + to_string(head->value) + to;
        long len_m = val.length();
        long len_l = (len - len_m) / 2;
        long len_r = len - len_m - len_l;
        val = get_space(len_l) + val + get_space(len_r);
        cout << get_space(height * len) + val << endl;
        print_in_order(head->left,height + 1,len,"^");
    }